

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

aiBone * findBone(aiScene *scene,char *name)

{
  uint uVar1;
  aiMesh **ppaVar2;
  aiBone **ppaVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  aiBone *unaff_R14;
  aiBone *paVar9;
  bool bVar10;
  
  uVar1 = scene->mNumMeshes;
  if ((ulong)uVar1 != 0) {
    ppaVar2 = scene->mMeshes;
    uVar8 = 0;
    do {
      uVar7 = (ulong)ppaVar2[uVar8]->mNumBones;
      bVar10 = uVar7 != 0;
      paVar9 = unaff_R14;
      if (bVar10) {
        ppaVar3 = ppaVar2[uVar8]->mBones;
        paVar9 = *ppaVar3;
        iVar5 = strcmp(name,(paVar9->mName).data);
        if (iVar5 != 0) {
          uVar4 = 1;
          do {
            uVar6 = uVar4;
            paVar9 = unaff_R14;
            if (uVar7 == uVar6) break;
            paVar9 = ppaVar3[uVar6];
            iVar5 = strcmp(name,(paVar9->mName).data);
            uVar4 = uVar6 + 1;
          } while (iVar5 != 0);
          bVar10 = uVar6 < uVar7;
        }
      }
      if (bVar10) {
        return paVar9;
      }
      uVar8 = uVar8 + 1;
      unaff_R14 = paVar9;
    } while (uVar8 != uVar1);
  }
  return (aiBone *)0x0;
}

Assistant:

aiBone* findBone( const aiScene* scene, const char * name) {
    for (size_t m=0; m<scene->mNumMeshes; m++) {
        aiMesh * mesh = scene->mMeshes[m];
        for (size_t b=0; b<mesh->mNumBones; b++) {
            aiBone * bone = mesh->mBones[b];
            if (0 == strcmp(name, bone->mName.C_Str())) {
                return bone;
            }
        }
    }
    return NULL;
}